

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int ddSiftingAux(DdManager *table,int x,int xLow,int xHigh)

{
  DdNode *pDVar1;
  Move *pMVar2;
  int iVar3;
  int result;
  int initialSize;
  Move *moveDown;
  Move *moveUp;
  Move *move;
  int xHigh_local;
  int xLow_local;
  int x_local;
  DdManager *table_local;
  
  iVar3 = table->keys - table->isolated;
  _result = (DdNode *)0x0;
  moveDown = (Move *)0x0;
  if (x == xLow) {
    _result = (DdNode *)ddSiftingDown(table,x,xHigh);
    if (_result == (DdNode *)0xffffffffffffffff) goto LAB_00a52d99;
    iVar3 = ddSiftingBackward(table,iVar3,(Move *)_result);
  }
  else if (x == xHigh) {
    moveDown = ddSiftingUp(table,x,xLow);
    if (moveDown == (Move *)0xffffffffffffffff) goto LAB_00a52d99;
    iVar3 = ddSiftingBackward(table,iVar3,moveDown);
  }
  else {
    xHigh_local = x;
    if (xHigh - x < x - xLow) {
      _result = (DdNode *)ddSiftingDown(table,x,xHigh);
      if (_result == (DdNode *)0xffffffffffffffff) goto LAB_00a52d99;
      if (_result != (DdNode *)0x0) {
        xHigh_local = _result->ref;
      }
      moveDown = ddSiftingUp(table,xHigh_local,xLow);
      if (moveDown == (Move *)0xffffffffffffffff) goto LAB_00a52d99;
      iVar3 = ddSiftingBackward(table,iVar3,moveDown);
    }
    else {
      moveDown = ddSiftingUp(table,x,xLow);
      if (moveDown == (Move *)0xffffffffffffffff) goto LAB_00a52d99;
      if (moveDown != (Move *)0x0) {
        xHigh_local = moveDown->x;
      }
      _result = (DdNode *)ddSiftingDown(table,xHigh_local,xHigh);
      if (_result == (DdNode *)0xffffffffffffffff) goto LAB_00a52d99;
      iVar3 = ddSiftingBackward(table,iVar3,(Move *)_result);
    }
  }
  if (iVar3 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar1 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar1;
    }
    while (moveDown != (Move *)0x0) {
      pMVar2 = moveDown->next;
      moveDown->y = 0;
      *(DdNode **)&moveDown->flags = table->nextFree;
      table->nextFree = (DdNode *)moveDown;
      moveDown = pMVar2;
    }
    return 1;
  }
LAB_00a52d99:
  if (_result != (DdNode *)0xffffffffffffffff) {
    while (_result != (DdNode *)0x0) {
      pDVar1 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar1;
    }
  }
  if (moveDown != (Move *)0xffffffffffffffff) {
    while (moveDown != (Move *)0x0) {
      pMVar2 = moveDown->next;
      moveDown->y = 0;
      *(DdNode **)&moveDown->flags = table->nextFree;
      table->nextFree = (DdNode *)moveDown;
      moveDown = pMVar2;
    }
  }
  return 0;
}

Assistant:

static int
ddSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh)
{

    Move        *move;
    Move        *moveUp;                /* list of up moves */
    Move        *moveDown;              /* list of down moves */
    int         initialSize;
    int         result;

    initialSize = table->keys - table->isolated;

    moveDown = NULL;
    moveUp = NULL;

    if (x == xLow) {
        moveDown = ddSiftingDown(table,x,xHigh);
        /* At this point x --> xHigh unless bounding occurred. */
        if (moveDown == (Move *) CUDD_OUT_OF_MEM) goto ddSiftingAuxOutOfMem;
        /* Move backward and stop at best position. */
        result = ddSiftingBackward(table,initialSize,moveDown);
        if (!result) goto ddSiftingAuxOutOfMem;

    } else if (x == xHigh) {
        moveUp = ddSiftingUp(table,x,xLow);
        /* At this point x --> xLow unless bounding occurred. */
        if (moveUp == (Move *) CUDD_OUT_OF_MEM) goto ddSiftingAuxOutOfMem;
        /* Move backward and stop at best position. */
        result = ddSiftingBackward(table,initialSize,moveUp);
        if (!result) goto ddSiftingAuxOutOfMem;

    } else if ((x - xLow) > (xHigh - x)) { /* must go down first: shorter */
        moveDown = ddSiftingDown(table,x,xHigh);
        /* At this point x --> xHigh unless bounding occurred. */
        if (moveDown == (Move *) CUDD_OUT_OF_MEM) goto ddSiftingAuxOutOfMem;
        if (moveDown != NULL) {
            x = moveDown->y;
        }
        moveUp = ddSiftingUp(table,x,xLow);
        if (moveUp == (Move *) CUDD_OUT_OF_MEM) goto ddSiftingAuxOutOfMem;
        /* Move backward and stop at best position */
        result = ddSiftingBackward(table,initialSize,moveUp);
        if (!result) goto ddSiftingAuxOutOfMem;

    } else { /* must go up first: shorter */
        moveUp = ddSiftingUp(table,x,xLow);
        /* At this point x --> xLow unless bounding occurred. */
        if (moveUp == (Move *) CUDD_OUT_OF_MEM) goto ddSiftingAuxOutOfMem;
        if (moveUp != NULL) {
            x = moveUp->x;
        }
        moveDown = ddSiftingDown(table,x,xHigh);
        if (moveDown == (Move *) CUDD_OUT_OF_MEM) goto ddSiftingAuxOutOfMem;
        /* Move backward and stop at best position. */
        result = ddSiftingBackward(table,initialSize,moveDown);
        if (!result) goto ddSiftingAuxOutOfMem;
    }

    while (moveDown != NULL) {
        move = moveDown->next;
        cuddDeallocMove(table, moveDown);
        moveDown = move;
    }
    while (moveUp != NULL) {
        move = moveUp->next;
        cuddDeallocMove(table, moveUp);
        moveUp = move;
    }

    return(1);

ddSiftingAuxOutOfMem:
    if (moveDown != (Move *) CUDD_OUT_OF_MEM) {
        while (moveDown != NULL) {
            move = moveDown->next;
            cuddDeallocMove(table, moveDown);
            moveDown = move;
        }
    }
    if (moveUp != (Move *) CUDD_OUT_OF_MEM) {
        while (moveUp != NULL) {
            move = moveUp->next;
            cuddDeallocMove(table, moveUp);
            moveUp = move;
        }
    }

    return(0);

}